

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline_alignment.cc
# Opt level: O0

Window * __thiscall
s2polyline_alignment::Window::Dilate(Window *__return_storage_ptr__,Window *this,int radius)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  const_reference pvVar4;
  reference pvVar5;
  int local_94;
  int local_90 [2];
  value_type local_88;
  int local_80;
  int local_7c;
  int local_78 [4];
  int row;
  int next_row;
  int prev_row;
  vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
  new_strides;
  S2LogMessage local_30;
  S2LogMessageVoidify local_1d;
  int local_1c;
  Window *pWStack_18;
  int radius_local;
  Window *this_local;
  
  local_1c = radius;
  pWStack_18 = this;
  this_local = __return_storage_ptr__;
  if (-1 < radius) {
    iVar1 = this->rows_;
    std::allocator<s2polyline_alignment::ColumnStride>::allocator
              ((allocator<s2polyline_alignment::ColumnStride> *)((long)&next_row + 3));
    std::
    vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::vector((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
              *)&prev_row,(long)iVar1,
             (allocator<s2polyline_alignment::ColumnStride> *)((long)&next_row + 3));
    std::allocator<s2polyline_alignment::ColumnStride>::~allocator
              ((allocator<s2polyline_alignment::ColumnStride> *)((long)&next_row + 3));
    for (local_78[2] = 0; local_78[2] < this->rows_; local_78[2] = local_78[2] + 1) {
      local_78[1] = 0;
      local_78[0] = local_78[2] - local_1c;
      piVar3 = std::max<int>(local_78 + 1,local_78);
      row = *piVar3;
      local_7c = local_78[2] + local_1c;
      local_80 = this->rows_ + -1;
      piVar3 = std::min<int>(&local_7c,&local_80);
      local_78[3] = *piVar3;
      local_90[1] = 0;
      pvVar4 = std::
               vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ::operator[](&this->strides_,(long)row);
      local_90[0] = pvVar4->start - local_1c;
      piVar3 = std::max<int>(local_90 + 1,local_90);
      local_88.start = *piVar3;
      pvVar4 = std::
               vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ::operator[](&this->strides_,(long)local_78[3]);
      local_94 = pvVar4->end + local_1c;
      piVar3 = std::min<int>(&local_94,&this->cols_);
      local_88.end = *piVar3;
      pvVar5 = std::
               vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               ::operator[]((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
                             *)&prev_row,(long)local_78[2]);
      *pvVar5 = local_88;
    }
    Window(__return_storage_ptr__,
           (vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
            *)&prev_row);
    std::
    vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
    ::~vector((vector<s2polyline_alignment::ColumnStride,_std::allocator<s2polyline_alignment::ColumnStride>_>
               *)&prev_row);
    return __return_storage_ptr__;
  }
  S2FatalLogMessage::S2FatalLogMessage
            ((S2FatalLogMessage *)&local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline_alignment.cc"
             ,0x5c,kFatal,(ostream *)&std::cerr);
  poVar2 = S2LogMessage::stream(&local_30);
  poVar2 = std::operator<<(poVar2,"Check failed: radius >= 0 ");
  poVar2 = std::operator<<(poVar2,"Negative dilation radius.");
  S2LogMessageVoidify::operator&(&local_1d,poVar2);
  S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_30);
}

Assistant:

Window Window::Dilate(const int radius) const {
  S2_DCHECK(radius >= 0) << "Negative dilation radius.";
  std::vector<ColumnStride> new_strides(rows_);
  int prev_row, next_row;
  for (int row = 0; row < rows_; ++row) {
    prev_row = std::max(0, row - radius);
    next_row = std::min(row + radius, rows_ - 1);
    new_strides[row] = {std::max(0, strides_[prev_row].start - radius),
                        std::min(strides_[next_row].end + radius, cols_)};
  }
  return Window(new_strides);
}